

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void WriteArrayVars(FSerializer *file,FWorldGlobalArray *vars,uint count,char *key)

{
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  bool bVar1;
  hash_t hVar2;
  ulong uVar3;
  FWorldGlobalArray *pFVar4;
  int *piVar5;
  ulong uVar6;
  FString arraykey;
  int v;
  FString local_50;
  FWorldGlobalArray *local_48;
  int local_3c;
  char *local_38;
  
  if (count != 0) {
    uVar6 = 0;
    local_48 = vars;
    do {
      hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(vars);
      if (hVar2 != 0) {
        bVar1 = FSerializer::BeginObject(file,key);
        if (!bVar1) {
          return;
        }
        if ((uint)uVar6 < count) {
          local_38 = FString::NullString.Nothing;
          pFVar4 = local_48;
          do {
            this = pFVar4 + uVar6;
            hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this);
            if (hVar2 != 0) {
              local_50.Chars = local_38;
              FString::NullString.RefCount = FString::NullString.RefCount + 1;
              FString::Format(&local_50,"%d",uVar6 & 0xffffffff);
              bVar1 = FSerializer::BeginObject(file,local_50.Chars);
              if (bVar1) {
                hVar2 = this->Size;
                if (hVar2 != 0) {
                  uVar3 = 0;
                  do {
                    uVar3 = uVar3 & 0xffffffff;
                    piVar5 = &this->Nodes[uVar3].Pair.Value;
                    while (*(long *)(piVar5 + -3) == 1) {
                      uVar3 = uVar3 + 1;
                      piVar5 = piVar5 + 4;
                      if (hVar2 <= uVar3) goto LAB_003b0680;
                    }
                    FString::Format(&local_50,"%d",(ulong)(uint)((IPair *)(piVar5 + -1))->Key);
                    local_3c = *piVar5;
                    Serialize(file,local_50.Chars,&local_3c,(int32_t *)0x0);
                    uVar3 = uVar3 + 1;
                    hVar2 = this->Size;
                  } while ((uint)uVar3 < hVar2);
                }
LAB_003b0680:
                FSerializer::EndObject(file);
                pFVar4 = local_48;
              }
              FString::~FString(&local_50);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != count);
        }
        FSerializer::EndObject(file);
        return;
      }
      uVar6 = uVar6 + 1;
      vars = vars + 1;
    } while (count != uVar6);
  }
  return;
}

Assistant:

static void WriteArrayVars (FSerializer &file, FWorldGlobalArray *vars, unsigned int count, const char *key)
{
	unsigned int i;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		if (file.BeginObject(key))
		{
			for(;i<count;i++)
			{
				if (vars[i].CountUsed())
				{
					FString arraykey;

					arraykey.Format("%d", i);
					if (file.BeginObject(arraykey))
					{
						FWorldGlobalArray::ConstIterator it(vars[i]);
						const FWorldGlobalArray::Pair *pair;

						while (it.NextPair(pair))
						{
							arraykey.Format("%d", pair->Key);
							int v = pair->Value;
							file(arraykey.GetChars(), v);
						}
						file.EndObject();
					}
				}
			}
			file.EndObject();
		}
	}
}